

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

void ZSTD_updateDUBT(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 mls)

{
  U32 hBits;
  U32 UVar1;
  U32 *pUVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  pUVar2 = ms->hashTable;
  hBits = (ms->cParams).hashLog;
  pUVar3 = ms->chainTable;
  uVar5 = (ms->cParams).chainLog;
  pBVar4 = (ms->window).base;
  uVar9 = (long)ip - (long)pBVar4;
  for (uVar8 = (ulong)ms->nextToUpdate; uVar8 < (uVar9 & 0xffffffff); uVar8 = uVar8 + 1) {
    sVar6 = ZSTD_hashPtr(pBVar4 + uVar8,hBits,(U32)iend);
    UVar1 = pUVar2[sVar6];
    uVar7 = (ulong)(((uint)uVar8 & ~(-1 << ((char)uVar5 - 1U & 0x1f))) * 2);
    pUVar2[sVar6] = (uint)uVar8;
    pUVar3[uVar7] = UVar1;
    pUVar3[uVar7 + 1] = 1;
  }
  ms->nextToUpdate = (U32)uVar9;
  return;
}

Assistant:

static void
ZSTD_updateDUBT(ZSTD_matchState_t* ms,
                const BYTE* ip, const BYTE* iend,
                U32 mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32  const hashLog = cParams->hashLog;

    U32* const bt = ms->chainTable;
    U32  const btLog  = cParams->chainLog - 1;
    U32  const btMask = (1 << btLog) - 1;

    const BYTE* const base = ms->window.base;
    U32 const target = (U32)(ip - base);
    U32 idx = ms->nextToUpdate;

    if (idx != target)
        DEBUGLOG(7, "ZSTD_updateDUBT, from %u to %u (dictLimit:%u)",
                    idx, target, ms->window.dictLimit);
    assert(ip + 8 <= iend);   /* condition for ZSTD_hashPtr */
    (void)iend;

    assert(idx >= ms->window.dictLimit);   /* condition for valid base+idx */
    for ( ; idx < target ; idx++) {
        size_t const h  = ZSTD_hashPtr(base + idx, hashLog, mls);   /* assumption : ip + 8 <= iend */
        U32    const matchIndex = hashTable[h];

        U32*   const nextCandidatePtr = bt + 2*(idx&btMask);
        U32*   const sortMarkPtr  = nextCandidatePtr + 1;

        DEBUGLOG(8, "ZSTD_updateDUBT: insert %u", idx);
        hashTable[h] = idx;   /* Update Hash Table */
        *nextCandidatePtr = matchIndex;   /* update BT like a chain */
        *sortMarkPtr = ZSTD_DUBT_UNSORTED_MARK;
    }
    ms->nextToUpdate = target;
}